

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__socket(int domain,int type,int protocol)

{
  int *piVar1;
  int local_20;
  int err;
  int sockfd;
  int protocol_local;
  int type_local;
  int domain_local;
  
  type_local = socket(domain,type | 0x80800,protocol);
  if (type_local == -1) {
    piVar1 = __errno_location();
    if (*piVar1 == 0x16) {
      type_local = socket(domain,type,protocol);
      if (type_local == -1) {
        piVar1 = __errno_location();
        type_local = -*piVar1;
      }
      else {
        local_20 = uv__nonblock_ioctl(type_local,1);
        if (local_20 == 0) {
          local_20 = uv__cloexec_ioctl(type_local,1);
        }
        if (local_20 != 0) {
          uv__close(type_local);
          type_local = local_20;
        }
      }
    }
    else {
      piVar1 = __errno_location();
      type_local = -*piVar1;
    }
  }
  return type_local;
}

Assistant:

int uv__socket(int domain, int type, int protocol) {
  int sockfd;
  int err;

#if defined(SOCK_NONBLOCK) && defined(SOCK_CLOEXEC)
  sockfd = socket(domain, type | SOCK_NONBLOCK | SOCK_CLOEXEC, protocol);
  if (sockfd != -1)
    return sockfd;

  if (errno != EINVAL)
    return -errno;
#endif

  sockfd = socket(domain, type, protocol);
  if (sockfd == -1)
    return -errno;

  err = uv__nonblock(sockfd, 1);
  if (err == 0)
    err = uv__cloexec(sockfd, 1);

  if (err) {
    uv__close(sockfd);
    return err;
  }

#if defined(SO_NOSIGPIPE)
  {
    int on = 1;
    setsockopt(sockfd, SOL_SOCKET, SO_NOSIGPIPE, &on, sizeof(on));
  }
#endif

  return sockfd;
}